

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void SparseKeygenRecurse<Blob<32>,Blob<224>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<32> *k,
               vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes)

{
  undefined1 in_CL;
  int in_EDX;
  uint32_t in_ESI;
  code *in_RDI;
  void *in_R8;
  Blob<32> *in_R9;
  int i;
  Blob<224> h;
  int nbits;
  int nbytes;
  uint32_t local_50;
  undefined1 local_4c [4];
  value_type *in_stack_ffffffffffffffb8;
  vector<Blob<224>,_std::allocator<Blob<224>_>_> *in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  undefined4 uVar2;
  int in_stack_ffffffffffffffe8;
  undefined3 in_stack_ffffffffffffffec;
  uint start_00;
  uint32_t uVar3;
  
  start_00 = CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff;
  uVar2 = 4;
  uVar1 = 0x20;
  local_50 = in_ESI;
  Blob<224>::Blob((Blob<224> *)local_4c);
  uVar3 = local_50;
  for (; (int)local_50 < 0x20; local_50 = local_50 + 1) {
    flipbit(in_R8,4,local_50);
    if (((start_00 & 0x1000000) != 0) || (in_EDX == 1)) {
      (*in_RDI)(in_R8,4,0,local_4c);
      std::vector<Blob<224>,_std::allocator<Blob<224>_>_>::push_back
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
    if (1 < in_EDX) {
      SparseKeygenRecurse<Blob<32>,Blob<224>>
                ((pfHash)CONCAT44(uVar3,in_EDX),start_00,in_stack_ffffffffffffffe8,
                 SUB81((ulong)in_R8 >> 0x38,0),in_R9,
                 (vector<Blob<224>,_std::allocator<Blob<224>_>_> *)CONCAT44(uVar2,uVar1));
    }
    flipbit(in_R8,4,local_50);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}